

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::makeBlurEffectIfNeeded(AbstractScrollAreaPrivate *this)

{
  qreal *pqVar1;
  BlurEffect *pBVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QObject *pQVar7;
  int local_154;
  int local_144;
  double local_130;
  int local_10c;
  int local_fc;
  double local_e8;
  int local_c4;
  int local_b4;
  double local_a8;
  int local_88;
  int local_7c;
  double local_70;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  QPoint local_38;
  QPoint maxPos;
  QSize s;
  QPoint p;
  QRect r;
  AbstractScrollAreaPrivate *this_local;
  
  if (this->horBlur->policy == BlurAlwaysOff) {
    normalizePosition(this);
    return;
  }
  _p = QWidget::rect(this->viewport);
  s.wd = (this->topLeftCorner).xp;
  s.ht = (this->topLeftCorner).yp;
  normalizePosition(this);
  maxPos = (QPoint)QWidget::size(this->viewport);
  iVar3 = QSize::width(&this->scrolledAreaSize);
  iVar4 = QSize::width((QSize *)&maxPos);
  iVar5 = QSize::height(&this->scrolledAreaSize);
  iVar6 = QSize::height((QSize *)&maxPos);
  QPoint::QPoint(&local_38,iVar3 - iVar4,iVar5 - iVar6);
  iVar3 = QPoint::x((QPoint *)&s);
  if (iVar3 < 0) {
LAB_001bb1f1:
    if ((this->horBlur->pressure < 1) &&
       (iVar3 = this->horBlur->pressure, iVar4 = QPoint::x((QPoint *)&s), 0 < iVar3 + iVar4)) {
      this->horBlur->pressure = 0;
    }
    else {
      iVar3 = this->horBlur->pressure;
      local_3c = QPoint::x((QPoint *)&s);
      local_3c = iVar3 + local_3c;
      iVar3 = qAbs<int>(&local_3c);
      pqVar1 = &this->horBlur->maxPressure;
      if ((double)iVar3 < *pqVar1 || (double)iVar3 == *pqVar1) {
        iVar3 = QPoint::x((QPoint *)&s);
        this->horBlur->pressure = iVar3 + this->horBlur->pressure;
      }
      else {
        if (this->horBlur->pressure < 0) {
          local_70 = -this->horBlur->maxPressure;
        }
        else {
          local_70 = this->horBlur->maxPressure;
        }
        this->horBlur->pressure = (int)local_70;
      }
    }
    pBVar2 = this->horBlur;
    pQVar7 = QObject::parent((QObject *)this->horBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_7c = QRect::x((QRect *)&p);
    }
    else {
      local_7c = QPoint::x(&this->topLeftCorner);
    }
    iVar3 = QWidget::width(&this->horBlur->super_QWidget);
    pQVar7 = QObject::parent((QObject *)this->horBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_88 = QRect::y((QRect *)&p);
    }
    else {
      local_88 = QPoint::y(&this->topLeftCorner);
    }
    iVar4 = QRect::height((QRect *)&p);
    iVar5 = QWidget::height(&this->horBlur->super_QWidget);
    QWidget::move(&pBVar2->super_QWidget,local_7c - iVar3 / 2,local_88 + (iVar4 - iVar5) / 2);
  }
  else if (this->horBlur->pressure < 0) {
    iVar3 = QPoint::x(&local_38);
    iVar4 = QPoint::x((QPoint *)&s);
    if (iVar4 <= iVar3) goto LAB_001bb1f1;
  }
  iVar3 = QPoint::y((QPoint *)&s);
  if (iVar3 < 0) {
LAB_001bb44d:
    if ((this->vertBlur->pressure < 1) &&
       (iVar3 = this->vertBlur->pressure, iVar4 = QPoint::y((QPoint *)&s), 0 < iVar3 + iVar4)) {
      this->vertBlur->pressure = 0;
    }
    else {
      iVar3 = this->vertBlur->pressure;
      local_40 = QPoint::y((QPoint *)&s);
      local_40 = iVar3 + local_40;
      iVar3 = qAbs<int>(&local_40);
      pqVar1 = &this->vertBlur->maxPressure;
      if ((double)iVar3 < *pqVar1 || (double)iVar3 == *pqVar1) {
        iVar3 = QPoint::y((QPoint *)&s);
        this->vertBlur->pressure = iVar3 + this->vertBlur->pressure;
      }
      else {
        if (this->vertBlur->pressure < 0) {
          local_a8 = -this->vertBlur->maxPressure;
        }
        else {
          local_a8 = this->vertBlur->maxPressure;
        }
        this->vertBlur->pressure = (int)local_a8;
      }
    }
    pBVar2 = this->vertBlur;
    pQVar7 = QObject::parent((QObject *)this->vertBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_b4 = QRect::x((QRect *)&p);
    }
    else {
      local_b4 = QPoint::x(&this->topLeftCorner);
    }
    iVar3 = QRect::width((QRect *)&p);
    iVar4 = QWidget::width(&this->vertBlur->super_QWidget);
    pQVar7 = QObject::parent((QObject *)this->vertBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_c4 = QRect::y((QRect *)&p);
    }
    else {
      local_c4 = QPoint::y(&this->topLeftCorner);
    }
    iVar5 = QWidget::height(&this->vertBlur->super_QWidget);
    QWidget::move(&pBVar2->super_QWidget,local_b4 + (iVar3 - iVar4) / 2,local_c4 - iVar5 / 2);
  }
  else if (this->vertBlur->pressure < 0) {
    iVar3 = QPoint::y(&local_38);
    iVar4 = QPoint::y((QPoint *)&s);
    if (iVar4 <= iVar3) goto LAB_001bb44d;
  }
  iVar3 = QPoint::x(&local_38);
  iVar4 = QPoint::x((QPoint *)&s);
  if ((iVar3 < iVar4) ||
     ((0 < this->horBlur->pressure && (iVar3 = QPoint::x((QPoint *)&s), 0 < iVar3)))) {
    if (this->horBlur->pressure < 0) {
LAB_001bb74f:
      iVar3 = this->horBlur->pressure;
      iVar4 = QPoint::x((QPoint *)&s);
      local_44 = QPoint::x(&local_38);
      local_44 = (iVar3 + iVar4) - local_44;
      iVar3 = qAbs<int>(&local_44);
      pqVar1 = &this->horBlur->maxPressure;
      if ((double)iVar3 < *pqVar1 || (double)iVar3 == *pqVar1) {
        iVar3 = QPoint::x((QPoint *)&s);
        iVar4 = QPoint::x(&local_38);
        this->horBlur->pressure = (iVar3 - iVar4) + this->horBlur->pressure;
      }
      else {
        if (this->horBlur->pressure < 0) {
          local_e8 = -this->horBlur->maxPressure;
        }
        else {
          local_e8 = this->horBlur->maxPressure;
        }
        this->horBlur->pressure = (int)local_e8;
      }
    }
    else {
      iVar3 = this->horBlur->pressure;
      iVar4 = QPoint::x((QPoint *)&s);
      iVar5 = QPoint::x(&local_38);
      if (-1 < (iVar3 + iVar4) - iVar5) goto LAB_001bb74f;
      this->horBlur->pressure = 0;
    }
    pBVar2 = this->horBlur;
    pQVar7 = QObject::parent((QObject *)this->horBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_fc = QRect::x((QRect *)&p);
    }
    else {
      local_fc = QPoint::x(&this->topLeftCorner);
    }
    iVar3 = QRect::width((QRect *)&p);
    iVar4 = QWidget::width(&this->horBlur->super_QWidget);
    pQVar7 = QObject::parent((QObject *)this->horBlur);
    if (pQVar7 == (QObject *)this->viewport) {
      local_10c = QRect::y((QRect *)&p);
    }
    else {
      local_10c = QPoint::y(&this->topLeftCorner);
    }
    iVar5 = QRect::height((QRect *)&p);
    iVar6 = QWidget::height(&this->horBlur->super_QWidget);
    QWidget::move(&pBVar2->super_QWidget,(local_fc + iVar3) - iVar4 / 2,
                  local_10c + (iVar5 - iVar6) / 2);
  }
  iVar3 = QPoint::y(&local_38);
  iVar4 = QPoint::y((QPoint *)&s);
  if ((iVar4 <= iVar3) &&
     ((this->vertBlur->pressure < 1 || (iVar3 = QPoint::y((QPoint *)&s), iVar3 < 1))))
  goto LAB_001bbc85;
  if (this->vertBlur->pressure < 0) {
LAB_001bba46:
    iVar3 = this->vertBlur->pressure;
    iVar4 = QPoint::y((QPoint *)&s);
    local_48 = QPoint::y(&local_38);
    local_48 = (iVar3 + iVar4) - local_48;
    iVar3 = qAbs<int>(&local_48);
    pqVar1 = &this->vertBlur->maxPressure;
    if ((double)iVar3 < *pqVar1 || (double)iVar3 == *pqVar1) {
      iVar3 = QPoint::y((QPoint *)&s);
      iVar4 = QPoint::y(&local_38);
      this->vertBlur->pressure = (iVar3 - iVar4) + this->vertBlur->pressure;
    }
    else {
      if (this->vertBlur->pressure < 0) {
        local_130 = -this->vertBlur->maxPressure;
      }
      else {
        local_130 = this->vertBlur->maxPressure;
      }
      this->vertBlur->pressure = (int)local_130;
    }
  }
  else {
    iVar3 = this->vertBlur->pressure;
    iVar4 = QPoint::y((QPoint *)&s);
    iVar5 = QPoint::y(&local_38);
    if (-1 < (iVar3 + iVar4) - iVar5) goto LAB_001bba46;
    this->vertBlur->pressure = 0;
  }
  pBVar2 = this->vertBlur;
  pQVar7 = QObject::parent((QObject *)this->vertBlur);
  if (pQVar7 == (QObject *)this->viewport) {
    local_144 = QRect::x((QRect *)&p);
  }
  else {
    local_144 = QPoint::x(&this->topLeftCorner);
  }
  iVar3 = QRect::width((QRect *)&p);
  iVar4 = QWidget::width(&this->vertBlur->super_QWidget);
  pQVar7 = QObject::parent((QObject *)this->vertBlur);
  if (pQVar7 == (QObject *)this->viewport) {
    local_154 = QRect::y((QRect *)&p);
  }
  else {
    local_154 = QPoint::y(&this->topLeftCorner);
  }
  iVar5 = QRect::height((QRect *)&p);
  iVar6 = QWidget::height(&this->vertBlur->super_QWidget);
  QWidget::move(&pBVar2->super_QWidget,local_144 + (iVar3 - iVar4) / 2,
                (local_154 + iVar5) - iVar6 / 2);
LAB_001bbc85:
  if (this->horBlur->pressure == 0) {
    QWidget::hide();
  }
  else {
    QWidget::raise();
    QWidget::show();
    QWidget::update();
  }
  if (this->vertBlur->pressure == 0) {
    QWidget::hide();
  }
  else {
    QWidget::raise();
    QWidget::show();
    QWidget::update();
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::makeBlurEffectIfNeeded()
{
	if( horBlur->policy != AbstractScrollArea::BlurAlwaysOff )
	{
		const QRect r = viewport->rect();

		const QPoint p = topLeftCorner;

		normalizePosition();

		const QSize s = viewport->size();

		const QPoint maxPos = QPoint( scrolledAreaSize.width() - s.width(),
			scrolledAreaSize.height() - s.height() );

		if( p.x() < 0 || ( horBlur->pressure < 0 && maxPos.x() >= p.x() ) )
		{
			if( horBlur->pressure <= 0 && horBlur->pressure + p.x() > 0 )
				horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += p.x();

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					- horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( p.y() < 0 || ( vertBlur->pressure < 0 && maxPos.y() >= p.y() ) )
		{
			if( vertBlur->pressure <= 0 && vertBlur->pressure + p.y() > 0 )
				vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += p.y();

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					- vertBlur->height() / 2 );
		}

		if( maxPos.x() < p.x() || ( horBlur->pressure > 0 && p.x() > 0 ) )
		{
			if( horBlur->pressure >= 0 &&
				horBlur->pressure + p.x() - maxPos.x() < 0 )
					horBlur->pressure = 0;
			else if( qAbs( horBlur->pressure + p.x() - maxPos.x() ) > horBlur->maxPressure )
				horBlur->pressure = ( horBlur->pressure < 0 ?
					- horBlur->maxPressure : horBlur->maxPressure );
			else
				horBlur->pressure += ( p.x() - maxPos.x() );

			horBlur->move(
				( horBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ r.width() - horBlur->width() / 2,
				( horBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ ( r.height() - horBlur->height() ) / 2 );
		}

		if( maxPos.y() < p.y() || ( vertBlur->pressure > 0 && p.y() > 0 ) )
		{
			if( vertBlur->pressure >= 0 &&
				vertBlur->pressure + p.y() - maxPos.y() < 0 )
					vertBlur->pressure = 0;
			else if( qAbs( vertBlur->pressure + p.y() - maxPos.y() ) > vertBlur->maxPressure )
				vertBlur->pressure = ( vertBlur->pressure < 0 ?
					- vertBlur->maxPressure : vertBlur->maxPressure );
			else
				vertBlur->pressure += ( p.y() - maxPos.y() );

			vertBlur->move(
				( vertBlur->parent() == viewport ? r.x() : topLeftCorner.x() )
					+ ( r.width() - vertBlur->width() ) / 2,
				( vertBlur->parent() == viewport ? r.y() : topLeftCorner.y() )
					+ r.height() - vertBlur->height() / 2 );
		}

		if( horBlur->pressure != 0 )
		{
			horBlur->raise();
			horBlur->show();
			horBlur->update();
		}
		else
			horBlur->hide();

		if( vertBlur->pressure != 0 )
		{
			vertBlur->raise();
			vertBlur->show();
			vertBlur->update();
		}
		else
			vertBlur->hide();
	}
	else
		normalizePosition();
}